

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTextDocument.cpp
# Opt level: O1

void __thiscall KDReports::TextDocument::preciseDump(TextDocument *this)

{
  return;
}

Assistant:

void KDReports::TextDocument::preciseDump()
{
#if 0
    qDebug() << "Dumping document:";
    QTextCursor cursor( &m_contentDocument );
    int i = 0;
    int currentBlock = -1;
    Q_FOREVER {
        const int blockNumber = cursor.block().blockNumber(); // needs Qt-4.4
        if ( blockNumber != currentBlock ) {
            currentBlock = blockNumber;
            qDebug() << " block" << currentBlock << "starts at char" << i;
            QTextFormat::PageBreakFlags flags = cursor.block().blockFormat().pageBreakPolicy();
            if ( flags & QTextFormat::PageBreak_AlwaysBefore )
                qDebug() << "  block" << currentBlock << "says: BREAK BEFORE";
            if ( flags & QTextFormat::PageBreak_AlwaysAfter )
                qDebug() << "  block" << currentBlock << "says: BREAK AFTER";
        }
        const QChar ch = m_contentDocument.characterAt( i );
        qDebug() << " char" << i << ch << ch.unicode(); // 8233 == paragraph separator

        if ( cursor.atEnd() ) {
            qDebug() << " document ends at" << cursor.position();
            break;
        }
        cursor.movePosition( QTextCursor::NextCharacter );
        ++i;
    }
#endif
}